

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool duckdb::ILikeOperatorFunction(string_t *str,string_t *pattern,char escape)

{
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  char (*result_data) [4];
  ulong input_length;
  char *input_data;
  ulong input_length_00;
  char *input_data_00;
  unique_ptr<char[],_std::default_delete<char>,_false> str_ldata;
  unique_ptr<char[],_std::default_delete<char>,_false> pat_ldata;
  string_t pat_lcase;
  string_t str_lcase;
  _Head_base<0UL,_char_*,_false> local_60;
  _Head_base<0UL,_char_*,_false> local_58;
  anon_union_16_2_67f50693_for_value local_50;
  anon_union_16_2_67f50693_for_value local_40;
  
  input_length_00 = (ulong)(str->value).pointer.length;
  if (input_length_00 < 0xd) {
    input_data = (str->value).pointer.prefix;
  }
  else {
    input_data = (str->value).pointer.ptr;
  }
  input_length = (ulong)(pattern->value).pointer.length;
  if (input_length < 0xd) {
    input_data_00 = (pattern->value).pointer.prefix;
  }
  else {
    input_data_00 = (pattern->value).pointer.ptr;
  }
  iVar2 = GetResultLength<false>(input_data,input_length_00);
  local_60._M_head_impl = (char *)operator_new__(iVar2);
  CaseConvert<false>(input_data,input_length_00,local_60._M_head_impl);
  iVar3 = GetResultLength<false>(input_data_00,input_length);
  result_data = (char (*) [4])operator_new__(iVar3);
  local_58._M_head_impl = (char *)result_data;
  CaseConvert<false>(input_data_00,input_length,(char *)result_data);
  local_40.pointer.length = (uint32_t)iVar2;
  if (local_40.pointer.length < 0xd) {
    local_40._12_4_ = 0;
    local_40.pointer.prefix[0] = '\0';
    local_40.pointer.prefix[1] = '\0';
    local_40.pointer.prefix[2] = '\0';
    local_40.pointer.prefix[3] = '\0';
    local_40._8_4_ = 0;
    if (local_40.pointer.length != 0) {
      switchD_01939fa4::default
                (local_40.pointer.prefix,local_60._M_head_impl,
                 (ulong)(local_40.pointer.length & 0xf));
    }
  }
  else {
    local_40.pointer.prefix = (char  [4])*(undefined4 *)local_60._M_head_impl;
    local_40._8_4_ = SUB84(local_60._M_head_impl,0);
    local_40._12_4_ = (undefined4)((ulong)local_60._M_head_impl >> 0x20);
  }
  local_50.pointer.length = (uint32_t)iVar3;
  if (local_50.pointer.length < 0xd) {
    local_50._12_4_ = 0;
    local_50.pointer.prefix[0] = '\0';
    local_50.pointer.prefix[1] = '\0';
    local_50.pointer.prefix[2] = '\0';
    local_50.pointer.prefix[3] = '\0';
    local_50._8_4_ = 0;
    if (local_50.pointer.length != 0) {
      switchD_01939fa4::default
                (local_50.pointer.prefix,result_data,(ulong)(local_50.pointer.length & 0xf));
    }
  }
  else {
    local_50.pointer.prefix = *result_data;
    local_50._8_4_ = SUB84(result_data,0);
    local_50._12_4_ = (undefined4)((ulong)result_data >> 0x20);
  }
  bVar1 = LikeOperatorFunction((string_t *)&local_40.pointer,(string_t *)&local_50.pointer,escape);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_58);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_60);
  return bVar1;
}

Assistant:

bool ILikeOperatorFunction(string_t &str, string_t &pattern, char escape = '\0') {
	auto str_data = str.GetData();
	auto str_size = str.GetSize();
	auto pat_data = pattern.GetData();
	auto pat_size = pattern.GetSize();

	// lowercase both the str and the pattern
	idx_t str_llength = LowerLength(str_data, str_size);
	auto str_ldata = make_unsafe_uniq_array_uninitialized<char>(str_llength);
	LowerCase(str_data, str_size, str_ldata.get());

	idx_t pat_llength = LowerLength(pat_data, pat_size);
	auto pat_ldata = make_unsafe_uniq_array_uninitialized<char>(pat_llength);
	LowerCase(pat_data, pat_size, pat_ldata.get());
	string_t str_lcase(str_ldata.get(), UnsafeNumericCast<uint32_t>(str_llength));
	string_t pat_lcase(pat_ldata.get(), UnsafeNumericCast<uint32_t>(pat_llength));
	return LikeOperatorFunction(str_lcase, pat_lcase, escape);
}